

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall ON_Material::DeleteTexture(ON_Material *this,wchar_t *filename,TYPE type)

{
  int iVar1;
  ON_Texture *pOVar2;
  ON_wString *this_00;
  int local_24;
  int local_20;
  int i;
  int deleted_count;
  TYPE type_local;
  wchar_t *filename_local;
  ON_Material *this_local;
  
  local_20 = 0;
  if ((filename == (wchar_t *)0x0) && (type == no_texture_type)) {
    iVar1 = ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
    ON_ClassArray<ON_Texture>::Destroy(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
    return iVar1;
  }
  local_24 = ON_ClassArray<ON_Texture>::Count(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
LAB_006bdded:
  do {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return local_20;
    }
  } while ((type != no_texture_type) &&
          (pOVar2 = ON_ClassArray<ON_Texture>::operator[]
                              (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_24),
          type != pOVar2->m_type));
  if (filename != (wchar_t *)0x0) goto code_r0x006bde2d;
  goto LAB_006bde5f;
code_r0x006bde2d:
  pOVar2 = ON_ClassArray<ON_Texture>::operator[]
                     (&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_24);
  this_00 = ON_FileReference::FullPath(&pOVar2->m_image_file_reference);
  iVar1 = ON_wString::ComparePath(this_00,filename);
  if (iVar1 == 0) {
LAB_006bde5f:
    ON_ClassArray<ON_Texture>::Remove(&(this->m_textures).super_ON_ClassArray<ON_Texture>,local_24);
    local_20 = local_20 + 1;
  }
  goto LAB_006bdded;
}

Assistant:

int ON_Material::DeleteTexture(const wchar_t* filename,ON_Texture::TYPE type )
{
  int deleted_count = 0;
  int i;

  if ( !filename && type == ON_Texture::TYPE::no_texture_type )
  {
    deleted_count = m_textures.Count();
    m_textures.Destroy();
  }
  else
  {
    for ( i = m_textures.Count()-1; i >= 0; i--)
    {
      if ( type != ON_Texture::TYPE::no_texture_type && type != m_textures[i].m_type )
        continue;
      if ( filename && m_textures[i].m_image_file_reference.FullPath().ComparePath(filename) )
        continue;
      m_textures.Remove(i);
      deleted_count++;
    }
  }
  return deleted_count;
}